

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

EncounteredQmlMacro __thiscall Moc::parseClassInfo(Moc *this,BaseDef *def)

{
  Data *pDVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  QTypeRevision QVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QArrayDataPointer<char> local_88;
  ClassInfoDef local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Parser::next(&this->super_Parser,LPAREN);
  local_68.value.d.d = (Data *)0x0;
  local_68.value.d.ptr = (char *)0x0;
  local_68.value.d.size = 0;
  Parser::next(&this->super_Parser,PP_STRING_LITERAL);
  Symbol::unquotedLexem
            ((QByteArray *)&local_88,
             (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
  local_68.name.d.ptr = local_88.ptr;
  local_68.name.d.d = local_88.d;
  local_88.d = (Data *)0x0;
  local_88.ptr = (char *)0x0;
  local_68.name.d.size = local_88.size;
  local_88.size = 0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  qVar6 = QByteArrayView::lengthHelperCharArray("QML.",5);
  bv.m_data = "QML.";
  bv.m_size = qVar6;
  bVar3 = QByteArray::startsWith(&local_68.name,bv);
  Parser::next(&this->super_Parser,COMMA);
  bVar4 = Parser::test(&this->super_Parser,PP_STRING_LITERAL);
  if (bVar4) {
    Symbol::unquotedLexem
              ((QByteArray *)&local_88,
               (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
  }
  else {
    bVar4 = Parser::test(&this->super_Parser,Q_REVISION_TOKEN);
    if (!bVar4) {
      Parser::next(&this->super_Parser,IDENTIFIER);
      Parser::next(&this->super_Parser,LPAREN);
      Parser::next(&this->super_Parser,PP_STRING_LITERAL);
      Symbol::unquotedLexem
                ((QByteArray *)&local_88,
                 (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
      qVar6 = local_68.value.d.size;
      pcVar2 = local_68.value.d.ptr;
      pDVar1 = local_68.value.d.d;
      local_68.value.d.d = local_88.d;
      local_68.value.d.ptr = local_88.ptr;
      local_88.d = pDVar1;
      local_88.ptr = pcVar2;
      local_68.value.d.size = local_88.size;
      local_88.size = qVar6;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
      Parser::next(&this->super_Parser,PP_RPAREN);
      goto LAB_00116dc1;
    }
    QVar5 = parseRevision(this);
    QByteArray::number((int)&local_88,(uint)(ushort)QVar5);
  }
  qVar6 = local_68.value.d.size;
  pcVar2 = local_68.value.d.ptr;
  pDVar1 = local_68.value.d.d;
  local_68.value.d.d = local_88.d;
  local_68.value.d.ptr = local_88.ptr;
  local_88.d = pDVar1;
  local_88.ptr = pcVar2;
  local_68.value.d.size = local_88.size;
  local_88.size = qVar6;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
LAB_00116dc1:
  Parser::next(&this->super_Parser,PP_RPAREN);
  QList<ClassInfoDef>::emplaceBack<ClassInfoDef_const&>(&def->classInfoList,&local_68);
  ClassInfoDef::~ClassInfoDef(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (EncounteredQmlMacro)!bVar3;
  }
  __stack_chk_fail();
}

Assistant:

Moc::EncounteredQmlMacro Moc::parseClassInfo(BaseDef *def)
{
    bool encounteredQmlMacro = false;
    next(LPAREN);
    ClassInfoDef infoDef;
    next(STRING_LITERAL);
    infoDef.name = symbol().unquotedLexem();
    if (infoDef.name.startsWith("QML."))
        encounteredQmlMacro = true;
    next(COMMA);
    if (test(STRING_LITERAL)) {
        infoDef.value = symbol().unquotedLexem();
    } else if (test(Q_REVISION_TOKEN)) {
        infoDef.value = QByteArray::number(parseRevision().toEncodedVersion<quint16>());
    } else {
        // support Q_CLASSINFO("help", QT_TR_NOOP("blah"))
        next(IDENTIFIER);
        next(LPAREN);
        next(STRING_LITERAL);
        infoDef.value = symbol().unquotedLexem();
        next(RPAREN);
    }
    next(RPAREN);
    def->classInfoList += infoDef;
    return encounteredQmlMacro ? EncounteredQmlMacro::Yes : EncounteredQmlMacro::No;
}